

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O1

void __thiscall
groundupdbext::MemoryKeyValueStore::Impl::Impl
          (Impl *this,
          unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
          *toCache)

{
  _Storage<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false>
  _Var1;
  
  (this->m_keyValueStore)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->m_keyValueStore)._M_h.field_0x78 = 0;
  *(undefined8 *)&(this->m_keyValueStore)._M_h._M_rehash_policy = 0;
  (this->m_keyValueStore)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_keyValueStore)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_keyValueStore)._M_h._M_element_count = 0;
  (this->m_keyValueStore)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_keyValueStore)._M_h._M_bucket_count = 0;
  *(undefined8 *)
   &(this->m_keyValueStore)._M_h.
    super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    .
    super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
    .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.field_0x30 = 0;
  *(undefined8 *)
   &(this->m_keyValueStore)._M_h.
    super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    .
    super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
    .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.field_0x38 = 0;
  (this->m_keyValueStore)._M_h.
  super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  .
  super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
  .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_hh =
       (HighwayHashCatT<1U> *)0x0;
  (this->m_keyValueStore)._M_h.
  super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  .
  super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
  .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_result =
       (HHResult64 *)0x0;
  *(uint64_t *)
   ((long)(this->m_keyValueStore)._M_h.
          super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          .
          super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
          .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key + 0x10) = 0
  ;
  *(uint64_t *)
   ((long)(this->m_keyValueStore)._M_h.
          super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          .
          super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
          .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key + 0x18) = 0
  ;
  (this->m_keyValueStore)._M_h.
  super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  .
  super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
  .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key[0] = 0;
  *(uint64_t *)
   ((long)(this->m_keyValueStore)._M_h.
          super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          .
          super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
          .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key + 8) = 0;
  HighwayHash::HighwayHash((HighwayHash *)this);
  (this->m_keyValueStore)._M_h._M_buckets = &(this->m_keyValueStore)._M_h._M_single_bucket;
  (this->m_keyValueStore)._M_h._M_bucket_count = 1;
  (this->m_keyValueStore)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_keyValueStore)._M_h._M_element_count = 0;
  (this->m_keyValueStore)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_keyValueStore)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_keyValueStore)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_listStore)._M_h.
  super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  .
  super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
  .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key[0] = 0;
  *(uint64_t *)
   ((long)(this->m_listStore)._M_h.
          super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          .
          super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
          .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key + 8) = 0;
  *(uint64_t *)
   ((long)(this->m_listStore)._M_h.
          super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          .
          super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
          .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key + 0x10) = 0
  ;
  *(uint64_t *)
   ((long)(this->m_listStore)._M_h.
          super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          .
          super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
          .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_key + 0x18) = 0
  ;
  (this->m_listStore)._M_h.
  super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  .
  super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
  .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_hh =
       (HighwayHashCatT<1U> *)0x0;
  (this->m_listStore)._M_h.
  super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  .
  super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
  .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.m_result =
       (HHResult64 *)0x0;
  *(undefined8 *)
   &(this->m_listStore)._M_h.
    super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    .
    super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
    .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.field_0x30 = 0;
  *(undefined8 *)
   &(this->m_listStore)._M_h.
    super__Hashtable_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    .
    super__Hash_code_base<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::__detail::_Select1st,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
    .super__Hashtable_ebo_helper<1,_groundupdbext::HighwayHash,_false>._M_tp.field_0x38 = 0;
  (this->m_listStore)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_listStore)._M_h._M_bucket_count = 0;
  (this->m_listStore)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_listStore)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->m_listStore)._M_h._M_rehash_policy = 0;
  (this->m_listStore)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_listStore)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->m_listStore)._M_h.field_0x78 = 0;
  HighwayHash::HighwayHash((HighwayHash *)&this->m_listStore);
  (this->m_listStore)._M_h._M_buckets = &(this->m_listStore)._M_h._M_single_bucket;
  (this->m_listStore)._M_h._M_bucket_count = 1;
  (this->m_listStore)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_listStore)._M_h._M_element_count = 0;
  (this->m_listStore)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_listStore)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_listStore)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _Var1 = (_Storage<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false>
           )(toCache->_M_t).
            super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
            ._M_t.
            super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
            .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  (toCache->_M_t).
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)0x0;
  (this->m_cachedStore).
  super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>_>
  ._M_payload = _Var1;
  (this->m_cachedStore).
  super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>_>
  ._M_engaged = true;
  return;
}

Assistant:

MemoryKeyValueStore::Impl::Impl(std::unique_ptr<KeyValueStore>& toCache)
  : m_keyValueStore(), m_listStore(), m_cachedStore(toCache.release())
{
  ;
}